

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss_test.cc
# Opt level: O0

void __thiscall
xLearn::LossTest_Predict_Linear_Test::~LossTest_Predict_Linear_Test
          (LossTest_Predict_Linear_Test *this)

{
  void *in_RDI;
  
  ~LossTest_Predict_Linear_Test((LossTest_Predict_Linear_Test *)0x18c778);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST_F(LossTest, Predict_Linear) {
  // Create Model for Linear Re
  Model model_lr;
  model_lr.Initialize(param.score_func,
                  param.loss_func,
                  param.num_feature,
                  param.num_field,
                  param.num_K,
                  param.auxiliary_size);
  real_t* w = model_lr.GetParameter_w();
  index_t num_w = model_lr.GetNumParameter_w();
  for (size_t i = 0; i < num_w; ++i) {
    w[i] = 2.0;
  }
  // Create Data matrix
  DMatrix matrix;
  matrix.ReAlloc(kLine);
  for (int i = 0; i < kLine; ++i) {
    matrix.Y[i] = 0;
    matrix.row[i] = new SparseRow;
    for (int j = 0; j < param.num_feature; ++j) {
      matrix.AddNode(i, j, 1.0);
    }
  }
  // Create loss function
  TestLoss loss;
  Score* score = new LinearScore;
  size_t threadNumber = std::thread::hardware_concurrency();
  ThreadPool* pool = new ThreadPool(threadNumber);
  loss.Initialize(score, pool);
  // Test
  std::vector<real_t> pred(kLine);
  loss.Predict(&matrix, model_lr, pred);
  for (int i = 0; i < kLine; ++i) {
    EXPECT_FLOAT_EQ(pred[i], 6.0);
  }
}